

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDF::newStream(QPDF *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle *in_RSI;
  QPDFObjectHandle QVar1;
  QPDFObjectHandle local_50;
  QPDFObjGen local_40;
  Stream local_38;
  BaseHandle local_28;
  QPDF *this_local;
  
  this_local = this;
  local_40 = nextObjGen((QPDF *)in_RSI);
  QPDFObjectHandle::newDictionary();
  ::qpdf::Stream::Stream(&local_38,(QPDF *)in_RSI,local_40,&local_50,0,0);
  ::qpdf::BaseHandle::operator_cast_to_QPDFObjectHandle(&local_28);
  makeIndirectObject(this,in_RSI);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_28);
  ::qpdf::Stream::~Stream(&local_38);
  QPDFObjectHandle::~QPDFObjectHandle(&local_50);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::newStream()
{
    return makeIndirectObject(
        qpdf::Stream(*this, nextObjGen(), QPDFObjectHandle::newDictionary(), 0, 0));
}